

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_24UL> *param_5)

{
  long lVar1;
  undefined8 uVar2;
  long local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  CappedArray<char,_24UL> local_30;
  
  operator*<double>(&local_48);
  Stringifier::operator*(&local_30,(Stringifier *)&STR,*(float *)(param_2 + 0x10));
  concat<kj::String,kj::StringPtr&,kj::CappedArray<char,24ul>>
            (__return_storage_ptr__,(_ *)&local_48,(String *)(param_2 + 0x18),(StringPtr *)&local_30
             ,param_5);
  uVar2 = uStack_40;
  lVar1 = local_48;
  if (local_48 != 0) {
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)*local_38)(local_38,lVar1,1,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}